

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

State * __thiscall re2::DFA::CachedState(DFA *this,int *inst,int ninst,uint32_t flag)

{
  iterator iVar1;
  State *pSVar2;
  long lVar3;
  int i;
  long lVar4;
  long lVar5;
  State *s;
  State state;
  State *local_58;
  uint32_t local_4c;
  size_t local_48;
  State local_40;
  
  local_58 = &local_40;
  local_40.inst_ = inst;
  local_40.ninst_ = ninst;
  local_40.flag_ = flag;
  iVar1 = std::
          _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->state_cache_)._M_h,&local_58);
  if (iVar1.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur == (__node_type *)0x0) {
    lVar5 = (long)this->prog_->bytemap_range_;
    lVar4 = ((long)ninst << 0x22) + (lVar5 + 1 << 0x23);
    lVar3 = lVar4 + 0x3800000000 >> 0x20;
    if (this->mem_budget_ < lVar3) {
      this->mem_budget_ = -1;
      local_58 = (State *)0x0;
    }
    else {
      local_48 = (long)ninst << 2;
      this->mem_budget_ = this->mem_budget_ - lVar3;
      local_4c = flag;
      pSVar2 = (State *)__gnu_cxx::new_allocator<char>::allocate
                                  ((new_allocator<char> *)&local_58,lVar4 + 0x1000000000 >> 0x20,
                                   (void *)0x0);
      for (lVar3 = 0; lVar3 <= lVar5; lVar3 = lVar3 + 1) {
        (&pSVar2[1].inst_)[lVar3] = (int *)0x0;
      }
      pSVar2->inst_ = &pSVar2[1].ninst_ + lVar5 * 2;
      local_58 = pSVar2;
      memmove(&pSVar2[1].ninst_ + lVar5 * 2,inst,local_48);
      pSVar2->ninst_ = ninst;
      pSVar2->flag_ = local_4c;
      std::__detail::
      _Insert_base<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&this->state_cache_,&local_58);
    }
  }
  else {
    local_58 = *(State **)
                ((long)iVar1.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur + 8);
  }
  return local_58;
}

Assistant:

DFA::State* DFA::CachedState(int* inst, int ninst, uint32_t flag) {
  //mutex_.AssertHeld();

  // Look in the cache for a pre-existing state.
  // We have to initialise the struct like this because otherwise
  // MSVC will complain about the flexible array member. :(
  State state;
  state.inst_ = inst;
  state.ninst_ = ninst;
  state.flag_ = flag;
  StateSet::iterator it = state_cache_.find(&state);
  if (it != state_cache_.end()) {
    if (ExtraDebug)
      fprintf(stderr, " -cached-> %s\n", DumpState(*it).c_str());
    return *it;
  }

  // Must have enough memory for new state.
  // In addition to what we're going to allocate,
  // the state cache hash table seems to incur about 40 bytes per
  // State*, empirically.
  const int kStateCacheOverhead = 40;
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  int mem = sizeof(State) + nnext*sizeof(std::atomic<State*>) +
            ninst*sizeof(int);
  if (mem_budget_ < mem + kStateCacheOverhead) {
    mem_budget_ = -1;
    return NULL;
  }
  mem_budget_ -= mem + kStateCacheOverhead;

  // Allocate new state along with room for next_ and inst_.
  char* space = std::allocator<char>().allocate(mem);
  State* s = new (space) State;
  (void) new (s->next_) std::atomic<State*>[nnext];
  // Work around a unfortunate bug in older versions of libstdc++.
  // (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=64658)
  for (int i = 0; i < nnext; i++)
    (void) new (s->next_ + i) std::atomic<State*>(NULL);
  s->inst_ = new (s->next_ + nnext) int[ninst];
  memmove(s->inst_, inst, ninst*sizeof s->inst_[0]);
  s->ninst_ = ninst;
  s->flag_ = flag;
  if (ExtraDebug)
    fprintf(stderr, " -> %s\n", DumpState(s).c_str());

  // Put state in cache and return it.
  state_cache_.insert(s);
  return s;
}